

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> * __thiscall
chaiscript::ChaiScript::eval<std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>>
          (ChaiScript *this,string *t_input,Exception_Handler *t_handler,string *t_filename)

{
  function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *in_RDI;
  Boxed_Value *bv;
  bool in_stack_00000d07;
  string *in_stack_00000d08;
  string *in_stack_00000d10;
  ChaiScript *in_stack_00000d18;
  Boxed_Value *in_stack_ffffffffffffffb0;
  Dispatch_Engine *in_stack_ffffffffffffffb8;
  
  do_eval(in_stack_00000d18,in_stack_00000d10,in_stack_00000d08,in_stack_00000d07);
  chaiscript::detail::Dispatch_Engine::
  boxed_cast<std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x31445b);
  return in_RDI;
}

Assistant:

T eval(const std::string &t_input, const Exception_Handler &t_handler = Exception_Handler(), const std::string &t_filename="__EVAL__")
    {
      try {
        return m_engine.boxed_cast<T>(do_eval(t_input, t_filename));
      } catch (Boxed_Value &bv) {
        if (t_handler) {
          t_handler->handle(bv, m_engine);
        }
        throw;
      }
    }